

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void ecs_clear(ecs_world_t *world,ecs_entity_t entity)

{
  _Bool _Var1;
  ecs_entities_t eVar2;
  undefined1 local_60 [8];
  ecs_entities_t to_remove;
  ecs_type_t type;
  ecs_table_t *table;
  ecs_entity_info_t info;
  ecs_stage_t *stage;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  entity_local = (ecs_entity_t)world;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x702);
  if (entity_local == 0) {
    __assert_fail("world != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x702,"void ecs_clear(ecs_world_t *, ecs_entity_t)");
  }
  _ecs_assert(entity != 0,2,(char *)0x0,"entity != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x703);
  if (entity == 0) {
    __assert_fail("entity != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x703,"void ecs_clear(ecs_world_t *, ecs_entity_t)");
  }
  info._24_8_ = ecs_get_stage((ecs_world_t **)&entity_local);
  _Var1 = ecs_defer_clear((ecs_world_t *)entity_local,(ecs_stage_t *)info._24_8_,entity);
  if (!_Var1) {
    info.record = (ecs_record_t *)0x0;
    ecs_get_info((ecs_world_t *)entity_local,entity,(ecs_entity_info_t *)&table);
    if (info.record != (ecs_record_t *)0x0) {
      to_remove._8_8_ = (info.record)->table;
      eVar2 = ecs_type_to_entities((ecs_type_t)to_remove._8_8_);
      local_60 = (undefined1  [8])eVar2.array;
      to_remove.array._0_4_ = eVar2.count;
      remove_entities_w_info
                ((ecs_world_t *)entity_local,entity,(ecs_entity_info_t *)&table,
                 (ecs_entities_t *)local_60);
    }
    ecs_defer_flush((ecs_world_t *)entity_local,(ecs_stage_t *)info._24_8_);
  }
  return;
}

Assistant:

void ecs_clear(
    ecs_world_t *world,
    ecs_entity_t entity)
{
    ecs_assert(world != NULL, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(entity != 0, ECS_INVALID_PARAMETER, NULL);

    ecs_stage_t *stage = ecs_get_stage(&world);
    if (ecs_defer_clear(world, stage, entity)) {
        return;
    }

    ecs_entity_info_t info;
    info.table = NULL;

    ecs_get_info(world, entity, &info);

    ecs_table_t *table = info.table;
    if (table) {
        ecs_type_t type = table->type;

        /* Remove all components */
        ecs_entities_t to_remove = ecs_type_to_entities(type);
        remove_entities_w_info(world, entity, &info, &to_remove);
    }    

    ecs_defer_flush(world, stage);
}